

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vli_decoder.c
# Opt level: O3

lzma_ret lzma_vli_decode(lzma_vli *vli,size_t *vli_pos,uint8_t *in,size_t *in_pos,size_t in_size)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  lzma_vli lVar6;
  ulong uVar7;
  long lVar8;
  ulong local_30;
  
  if (vli_pos == (size_t *)0x0) {
    *vli = 0;
    uVar4 = *in_pos;
    if (in_size <= uVar4) {
      return LZMA_DATA_ERROR;
    }
    vli_pos = &local_30;
    lVar6 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = *vli_pos;
    if (uVar5 == 0) {
      *vli = 0;
      lVar6 = 0;
    }
    else {
      if (8 < uVar5) {
        return LZMA_PROG_ERROR;
      }
      lVar6 = *vli;
    }
    if (lVar6 >> ((char)uVar5 * '\a' & 0x3fU) != 0) {
      return LZMA_PROG_ERROR;
    }
    uVar4 = *in_pos;
    if (in_size <= uVar4) {
      return LZMA_BUF_ERROR;
    }
  }
  uVar7 = uVar4 + 1;
  if (uVar4 + 1 < in_size) {
    uVar7 = in_size;
  }
  lVar3 = uVar5 * 7;
  lVar8 = 0;
  while( true ) {
    bVar2 = in[lVar8 + uVar4];
    lVar6 = ((ulong)(bVar2 & 0x7f) << ((byte)lVar3 & 0x3f)) + lVar6;
    if (-1 < (char)bVar2) {
      *in_pos = uVar4 + 1 + lVar8;
      uVar4 = uVar5 + 1 + lVar8;
      *vli_pos = uVar4;
      *vli = lVar6;
      if (bVar2 == 0 && 1 < uVar4) {
        return LZMA_DATA_ERROR;
      }
      return (uint)(vli_pos != &local_30);
    }
    if (uVar5 + lVar8 == 8) break;
    lVar3 = lVar3 + 7;
    lVar1 = uVar4 + lVar8;
    lVar8 = lVar8 + 1;
    if (in_size <= lVar1 + 1U) {
      *in_pos = uVar7;
      *vli_pos = uVar5 + lVar8;
      *vli = lVar6;
      return (uint)(vli_pos == &local_30) * 9;
    }
  }
  *in_pos = (uVar4 - uVar5) + 9;
  *vli_pos = 9;
  *vli = lVar6;
  return LZMA_DATA_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_vli_decode(lzma_vli *LZMA_RESTRICT vli, size_t *vli_pos,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size)
{
	// If we haven't been given vli_pos, work in single-call mode.
	size_t vli_pos_internal = 0;
	if (vli_pos == NULL) {
		vli_pos = &vli_pos_internal;
		*vli = 0;

		// If there's no input, use LZMA_DATA_ERROR. This way it is
		// easy to decode VLIs from buffers that have known size,
		// and get the correct error code in case the buffer is
		// too short.
		if (*in_pos >= in_size)
			return LZMA_DATA_ERROR;

	} else {
		// Initialize *vli when starting to decode a new integer.
		if (*vli_pos == 0)
			*vli = 0;

		// Validate the arguments.
		if (*vli_pos >= LZMA_VLI_BYTES_MAX
				|| (*vli >> (*vli_pos * 7)) != 0)
			return LZMA_PROG_ERROR;;

		if (*in_pos >= in_size)
			return LZMA_BUF_ERROR;
	}

	do {
		// Read the next byte. Use a temporary variable so that we
		// can update *in_pos immediately.
		const uint8_t byte = in[*in_pos];
		++*in_pos;

		// Add the newly read byte to *vli.
		*vli += (lzma_vli)(byte & 0x7F) << (*vli_pos * 7);
		++*vli_pos;

		// Check if this is the last byte of a multibyte integer.
		if ((byte & 0x80) == 0) {
			// We don't allow using variable-length integers as
			// padding i.e. the encoding must use the most the
			// compact form.
			if (byte == 0x00 && *vli_pos > 1)
				return LZMA_DATA_ERROR;

			return vli_pos == &vli_pos_internal
					? LZMA_OK : LZMA_STREAM_END;
		}

		// There is at least one more byte coming. If we have already
		// read maximum number of bytes, the integer is considered
		// corrupt.
		//
		// If we need bigger integers in future, old versions liblzma
		// will confusingly indicate the file being corrupt istead of
		// unsupported. I suppose it's still better this way, because
		// in the foreseeable future (writing this in 2008) the only
		// reason why files would appear having over 63-bit integers
		// is that the files are simply corrupt.
		if (*vli_pos == LZMA_VLI_BYTES_MAX)
			return LZMA_DATA_ERROR;

	} while (*in_pos < in_size);

	return vli_pos == &vli_pos_internal ? LZMA_DATA_ERROR : LZMA_OK;
}